

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O1

void __thiscall
pg::PSISolver::compute_all_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head)

{
  Worker *pWVar1;
  TD_compute_val *t;
  Task *__dq_head;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  iVar2 = 0;
  reset_done_CALL(__lace_worker,__lace_dq_head,0,(int)((this->super_Solver).game)->n_vertices);
  set_in_CALL(__lace_worker,__lace_dq_head,0,(int)((this->super_Solver).game)->n_vertices);
  if (0 < ((this->super_Solver).game)->n_vertices) {
    lVar3 = 0;
    iVar2 = 0;
    do {
      if ((*(int *)(done + lVar3 * 4) != 3) &&
         ((lVar4 = (long)*(int *)(str + lVar3 * 4), lVar4 == -1 || (*(int *)(halt + lVar4 * 4) != 0)
          ))) {
        if (__lace_worker->end == __lace_dq_head) {
          lace_abort_stack_overflow();
        }
        __lace_dq_head->f = compute_val_WRAP;
        (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
        *(int *)__lace_dq_head->d = (int)lVar3;
        *(PSISolver **)(__lace_dq_head->d + 8) = this;
        pWVar1 = __lace_worker->_public;
        if (__lace_worker->allstolen == '\0') {
          if (pWVar1->movesplit != '\0') {
            uVar5 = (uint)((int)((ulong)((long)__lace_dq_head - (long)__lace_worker->dq) >> 6) + 2 +
                          (int)((ulong)((long)__lace_worker->split - (long)__lace_worker->dq) >> 6))
                    >> 1;
            LOCK();
            *(uint *)((long)&pWVar1->ts + 4) = uVar5;
            UNLOCK();
            __lace_worker->split = __lace_worker->dq + uVar5;
            pWVar1->movesplit = '\0';
          }
        }
        else {
          if (pWVar1->movesplit != '\0') {
            pWVar1->movesplit = '\0';
          }
          uVar6 = (long)__lace_dq_head - (long)__lace_worker->dq;
          LOCK();
          pWVar1->ts = (TailSplit)
                       ((uVar6 >> 6 & 0xffffffff | (uVar6 & 0xffffffffffffffc0) << 0x1a) +
                       0x100000000);
          UNLOCK();
          pWVar1->allstolen = '\0';
          __lace_worker->split = __lace_dq_head + 1;
          __lace_worker->allstolen = '\0';
        }
        __lace_dq_head = __lace_dq_head + 1;
        iVar2 = iVar2 + 1;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < ((this->super_Solver).game)->n_vertices);
  }
  for (; iVar2 != 0; iVar2 = iVar2 + -1) {
    __dq_head = __lace_dq_head + -1;
    if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= __dq_head)) {
      __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
      compute_val(*(PSISolver **)(__lace_dq_head[-1].d + 8),__lace_worker,__dq_head,
                  *(int *)__lace_dq_head[-1].d);
    }
    else {
      compute_val_SYNC_SLOW(__lace_worker,__dq_head);
    }
    __lace_dq_head = __dq_head;
  }
  return;
}

Assistant:

void
PSISolver::compute_all_val(WorkerP* __lace_worker, Task* __lace_dq_head)
{
    // reset "done" (for nodes that are not disabled or won)
    CALL(reset_done, 0, nodecount());
    CALL(set_in, 0, nodecount());
    // for all unsolved enabled nodes that go to sink, run compute val
    int count = 0;
    for (int i=0; i<nodecount(); i++) {
        if (done[i] == 3) continue;
        if (str[i] == -1 or halt[str[i]]) { // str[i] is -2 for disabled and not -1 for won
            SPAWN(compute_val, i, this);
            count++;
        }
    }
    while (count--) {
        SYNC(compute_val);
    }
}